

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O0

void __thiscall tvm::runtime::TVMRetValue::Clear(TVMRetValue *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  PackedFunc *this_01;
  Module *this_02;
  NodePtr<tvm::Node> *this_03;
  ExtTypeVTable *pEVar1;
  TVMRetValue *this_local;
  
  if ((this->super_TVMPODValue_).type_code_ != 4) {
    switch((this->super_TVMPODValue_).type_code_) {
    case 8:
      this_03 = TVMPODValue_::ptr<tvm::NodePtr<tvm::Node>>(&this->super_TVMPODValue_);
      if (this_03 != (NodePtr<tvm::Node> *)0x0) {
        NodePtr<tvm::Node>::~NodePtr(this_03);
        operator_delete(this_03,8);
      }
      break;
    case 9:
      this_02 = TVMPODValue_::ptr<tvm::runtime::Module>(&this->super_TVMPODValue_);
      if (this_02 != (Module *)0x0) {
        Module::~Module(this_02);
        operator_delete(this_02,0x10);
      }
      break;
    case 10:
      this_01 = TVMPODValue_::ptr<tvm::runtime::PackedFunc>(&this->super_TVMPODValue_);
      if (this_01 != (PackedFunc *)0x0) {
        PackedFunc::~PackedFunc(this_01);
        operator_delete(this_01,0x20);
      }
      break;
    case 0xb:
      this_00 = TVMPODValue_::ptr<std::__cxx11::string>(&this->super_TVMPODValue_);
      if (this_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::__cxx11::string::~string((string *)this_00);
        operator_delete(this_00,0x20);
      }
      break;
    case 0xd:
      NDArray::Container::DecRef((Container *)(this->super_TVMPODValue_).value_.v_handle);
    }
    if (0xf < (this->super_TVMPODValue_).type_code_) {
      pEVar1 = ExtTypeVTable::Get((this->super_TVMPODValue_).type_code_);
      (*pEVar1->destroy)((this->super_TVMPODValue_).value_.v_handle);
    }
    (this->super_TVMPODValue_).type_code_ = 4;
  }
  return;
}

Assistant:

void Clear() {
    if (type_code_ == kNull)
      return;
    switch (type_code_) {
    case kStr:
      delete ptr<std::string>();
      break;
    case kFuncHandle:
      delete ptr<PackedFunc>();
      break;
    case kModuleHandle:
      delete ptr<Module>();
      break;
    case kNodeHandle:
      delete ptr<NodePtr<Node>>();
      break;
    case kNDArrayContainer: {
      static_cast<NDArray::Container *>(value_.v_handle)->DecRef();
      break;
    }
    }
    if (type_code_ > kExtBegin) {
#if TVM_RUNTIME_HEADER_ONLY
      LOG(FATAL) << "Header only mode do not support ext type";
#else
      (*(ExtTypeVTable::Get(type_code_)->destroy))(value_.v_handle);
#endif
    }
    type_code_ = kNull;
  }